

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

void CombinationKeygenRecurse<unsigned_long,block16>
               (block16 *key,int len,int maxlen,block16 *blocks,int blockcount,pfHash hash,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *hashes)

{
  undefined8 *puVar1;
  long in_RCX;
  undefined8 *puVar2;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  code *in_R9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *unaff_retaddr;
  unsigned_long h;
  int i;
  value_type_conflict2 *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar3;
  undefined4 in_stack_ffffffffffffffe0;
  
  if (in_ESI != in_EDX) {
    for (iVar3 = 0; iVar3 < in_R8D; iVar3 = iVar3 + 1) {
      puVar2 = (undefined8 *)(in_RCX + (long)iVar3 * 0x10);
      puVar1 = (undefined8 *)(in_RDI + (long)in_ESI * 0x10);
      *puVar1 = *puVar2;
      puVar1[1] = puVar2[1];
      (*in_R9)(in_RDI,((long)(in_ESI + 1) & 0xfffffffU) << 4,0,&stack0xffffffffffffffc8);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 CONCAT44(iVar3,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8);
      CombinationKeygenRecurse<unsigned_long,block16>
                ((block16 *)CONCAT44(in_ESI,in_EDX),(int)((ulong)in_RCX >> 0x20),(int)in_RCX,
                 (block16 *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),(int)((ulong)in_R9 >> 0x20),
                 (pfHash)CONCAT44(iVar3,in_stack_ffffffffffffffd0),unaff_retaddr);
    }
  }
  return;
}

Assistant:

void CombinationKeygenRecurse ( blocktype * key, int len, int maxlen,
                  blocktype * blocks, int blockcount,
                  pfHash hash, std::vector<hashtype> & hashes )
{
  if(len == maxlen) return;  // end recursion

  for(int i = 0; i < blockcount; i++)
  {
    key[len] = blocks[i];

    //if(len == maxlen-1)
    {
      hashtype h;
      hash(key, (len+1) * sizeof(blocktype), 0, &h);
      hashes.push_back(h);
    }

    //else
    {
      CombinationKeygenRecurse(key,len+1,maxlen,blocks,blockcount,hash,hashes);
    }
  }
}